

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

void __thiscall
MenuBar::bindSlot(MenuBar *this,ActionMenu actionMenu,function<void_()> *slot,
                 QMainWindow *mainWindow,QString *text)

{
  _Base_ptr *signal;
  QMainWindow *pQVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>,_bool> pVar2;
  Object local_58 [12];
  ActionMenu local_4c;
  QMainWindow *local_48;
  function<void_()> local_40;
  
  local_4c = actionMenu;
  local_48 = mainWindow;
  pVar2 = std::
          _Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
          ::_M_emplace_unique<ActionMenu&,QMainWindow*&>
                    ((_Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
                      *)this,&local_4c,&local_48);
  signal = &pVar2.first._M_node._M_node[1]._M_parent;
  QAction::setText((QString *)signal);
  pQVar1 = local_48;
  std::function<void_()>::function(&local_40,slot);
  QObject::connect<void(QAction::*)(bool),std::function<void()>>
            (local_58,(offset_in_QAction_to_subr)signal,(QObject *)QAction::triggered,
             (function<void_()> *)0x0,(ConnectionType)pQVar1);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void MenuBar::bindSlot( ActionMenu actionMenu, std::function<void( void )> slot, QMainWindow* mainWindow, const QString& text )
{
    auto [it, _] = mapAction.emplace( actionMenu, mainWindow );
    it->second.setText( text );
    QObject::connect( &it->second, &QAction::triggered, mainWindow, slot );
}